

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O3

_Bool borg_equips_item(wchar_t activation,_Bool check_charge)

{
  ushort uVar1;
  long lVar2;
  _Bool _Var3;
  
  _Var3 = borg.activation[activation] != 0;
  if (check_charge && _Var3) {
    uVar1 = z_info->pack_size;
    lVar2 = 0x72;
    do {
      if (((borg_items[uVar1].desc[lVar2 + -0xe] != '\0') &&
          (*(wchar_t *)(borg_items[uVar1].desc + lVar2 + -6) == activation)) &&
         (*(short *)(borg_items[uVar1].desc + lVar2) < 1)) {
        return true;
      }
      lVar2 = lVar2 + 0x388;
    } while (lVar2 != 0x2ad2);
    _Var3 = false;
  }
  return _Var3;
}

Assistant:

bool borg_equips_item(int activation, bool check_charge)
{
    int i;

    /* a quick check of the array */
    if (!borg.activation[activation])
        return false;
    else if (!check_charge)
        return true;

    /* Check the equipment */
    for (i = INVEN_WIELD; i < INVEN_TOTAL; i++) {
        borg_item *item = &borg_items[i];

        if (!item->iqty)
            continue;

        /* Skip wrong activation */
        if (item->activ_idx != activation)
            continue;

        /* Check charge.  */
        if (check_charge && (item->timeout >= 1))
            continue;

        /* Success */
        return true;
    }

    /* I do not have it or it is not charged */
    return false;
}